

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

float deqp::gles3::Performance::anon_unknown_1::getAreaBetweenLines
                (float xmin,float xmax,float lineAOffset,float lineACoefficient,float lineBOffset,
                float lineBCoefficient)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float rightHeight;
  float leftHeight;
  float epsilon;
  float approachCoeffient;
  float lineBHeight;
  float lineAHeight;
  float width;
  float midpoint;
  bool aOverBAtEnd;
  bool aOverBAtBegin;
  float lineBMax;
  float lineBMin;
  float lineAMax;
  float lineAMin;
  float lineBCoefficient_local;
  float lineBOffset_local;
  float lineACoefficient_local;
  float lineAOffset_local;
  float xmax_local;
  float xmin_local;
  
  fVar1 = lineACoefficient * xmin + lineAOffset;
  fVar2 = lineACoefficient * xmax + lineAOffset;
  fVar3 = lineBCoefficient * xmin + lineBOffset;
  fVar4 = lineBCoefficient * xmax + lineBOffset;
  if (fVar3 < fVar1 == fVar4 < fVar2) {
    fVar1 = (xmin + xmax) / 2.0;
    fVar1 = de::abs<float>((lineACoefficient * fVar1 + lineAOffset) -
                           (lineBCoefficient * fVar1 + lineBOffset));
    xmax_local = (xmax - xmin) * fVar1;
  }
  else {
    fVar5 = de::abs<float>(lineACoefficient - lineBCoefficient);
    fVar1 = de::abs<float>(fVar1 - fVar3);
    fVar2 = de::abs<float>(fVar2 - fVar4);
    if (0.0001 <= fVar5) {
      xmax_local = fVar1 * 0.5 * (fVar1 / fVar5) + fVar2 * 0.5 * (fVar2 / fVar5);
    }
    else {
      xmax_local = 0.0;
    }
  }
  return xmax_local;
}

Assistant:

static float getAreaBetweenLines (float xmin, float xmax, float lineAOffset, float lineACoefficient, float lineBOffset, float lineBCoefficient)
{
	const float lineAMin		= lineAOffset + lineACoefficient * xmin;
	const float lineAMax		= lineAOffset + lineACoefficient * xmax;
	const float lineBMin		= lineBOffset + lineBCoefficient * xmin;
	const float lineBMax		= lineBOffset + lineBCoefficient * xmax;
	const bool	aOverBAtBegin	= (lineAMin > lineBMin);
	const bool	aOverBAtEnd		= (lineAMax > lineBMax);

	if (aOverBAtBegin == aOverBAtEnd)
	{
		// lines do not intersect

		const float midpoint	= (xmin + xmax) / 2.0f;
		const float width		= (xmax - xmin);

		const float lineAHeight	= lineAOffset + lineACoefficient * midpoint;
		const float lineBHeight	= lineBOffset + lineBCoefficient * midpoint;

		return width * de::abs(lineAHeight - lineBHeight);
	}
	else
	{

		// lines intersect

		const float approachCoeffient	= de::abs(lineACoefficient - lineBCoefficient);
		const float epsilon				= 0.0001f;
		const float leftHeight			= de::abs(lineAMin - lineBMin);
		const float rightHeight			= de::abs(lineAMax - lineBMax);

		if (approachCoeffient < epsilon)
			return 0.0f;

		return (0.5f * leftHeight * (leftHeight / approachCoeffient)) + (0.5f * rightHeight * (rightHeight / approachCoeffient));
	}
}